

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::IsObjectOrNull(Var instance)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  Type TVar5;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ab95e1;
    *puVar4 = 0;
LAB_00ab94db:
    this = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ab95e1;
      *puVar4 = 0;
    }
    TVar5 = ((this->type).ptr)->typeId;
    if ((int)TVar5 < 0x58) goto LAB_00ab95c9;
    BVar3 = RecyclableObject::IsExternal(this);
    if (BVar3 != 0) goto LAB_00ab95c9;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
LAB_00ab95e1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)instance & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)instance & 0xffff000000000000) != 0x1000000000000) {
      TVar5 = TypeIds_FirstNumberType;
      if ((((ulong)instance & 0xffff000000000000) == 0x1000000000000) ||
         (TVar5 = TypeIds_Number, (ulong)instance >> 0x32 != 0)) goto LAB_00ab95c9;
      goto LAB_00ab94db;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab95e1;
    TVar5 = TypeIds_FirstNumberType;
  }
  *puVar4 = 0;
LAB_00ab95c9:
  return (BOOL)(TVar5 == TypeIds_Null || 0x16 < (int)TVar5);
}

Assistant:

BOOL JavascriptOperators::IsObjectOrNull(Var instance)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_IsObjectOrNull);
        TypeId typeId = GetTypeId(instance);
        return IsObjectType(typeId) || typeId == TypeIds_Null;
        JIT_HELPER_END(Op_IsObjectOrNull);
    }